

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

int tcp_listener_set_keepalive(void *arg,void *buf,size_t sz,nni_type t)

{
  _Bool local_3d;
  int local_3c;
  _Bool b;
  void *pvStack_38;
  int rv;
  tcp_listener *l;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  pvStack_38 = arg;
  l._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  local_3c = nni_copyin_bool(&local_3d,buf,sz,t);
  arg_local._4_4_ = local_3c;
  if ((local_3c == 0) && (pvStack_38 != (void *)0x0)) {
    nni_mtx_lock((nni_mtx *)((long)pvStack_38 + 0x130));
    *(byte *)((long)pvStack_38 + 299) = local_3d & 1;
    nni_mtx_unlock((nni_mtx *)((long)pvStack_38 + 0x130));
    arg_local._4_4_ = 0;
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcp_listener_set_keepalive(void *arg, const void *buf, size_t sz, nni_type t)
{
	tcp_listener *l = arg;
	int           rv;
	bool          b;

	if (((rv = nni_copyin_bool(&b, buf, sz, t)) != 0) || (l == NULL)) {
		return (rv);
	}
	nni_mtx_lock(&l->mtx);
	l->keepalive = b;
	nni_mtx_unlock(&l->mtx);
	return (0);
}